

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::GetOwnPropertyNoHostObjectForHeapEnum
              (Var instance,PropertyId propertyId,ScriptContext *requestContext,Var *getter,
              Var *setter)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  PropertyQueryFlags val;
  undefined4 *puVar5;
  JavascriptLibrary *pJVar6;
  int local_4c;
  RecyclableObject *pRStack_48;
  BOOL result;
  Var returnVar;
  DynamicObject *dynamicObject;
  Var *setter_local;
  Var *getter_local;
  ScriptContext *requestContext_local;
  Var pvStack_18;
  PropertyId propertyId_local;
  Var instance_local;
  
  dynamicObject = (DynamicObject *)setter;
  setter_local = getter;
  getter_local = (Var *)requestContext;
  requestContext_local._4_4_ = propertyId;
  pvStack_18 = instance;
  bVar2 = TaggedNumber::Is(instance);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x6ee,"(!TaggedNumber::Is(instance))",
                                "GetDataPropertyNoHostObject int passed");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  BVar3 = HasOwnPropertyNoHostObjectForHeapEnum
                    (pvStack_18,requestContext_local._4_4_,(ScriptContext *)getter_local,
                     setter_local,(Var *)dynamicObject);
  if (((BVar3 == 0) && (*setter_local == (Var)0x0)) &&
     ((dynamicObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject == (_func_int **)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x6ef,
                                "(HasOwnPropertyNoHostObjectForHeapEnum(instance, propertyId, requestContext, getter, setter) || getter || setter)"
                                ,
                                "HasOwnPropertyNoHostObjectForHeapEnum(instance, propertyId, requestContext, getter, setter) || getter || setter"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  returnVar = VarTo<Js::DynamicObject>(pvStack_18);
  (dynamicObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)0x0;
  *setter_local = (Var)0x0;
  if ((DynamicObject *)returnVar == (DynamicObject *)0x0) {
    pJVar6 = ScriptContext::GetLibrary((ScriptContext *)getter_local);
    instance_local = JavascriptLibraryBase::GetUndefined(&pJVar6->super_JavascriptLibraryBase);
  }
  else {
    pJVar6 = ScriptContext::GetLibrary((ScriptContext *)getter_local);
    pRStack_48 = JavascriptLibraryBase::GetUndefined(&pJVar6->super_JavascriptLibraryBase);
    local_4c = 0;
    iVar4 = (**(code **)(*returnVar + 0x78))();
    if (iVar4 == 0) {
      iVar4 = (**(code **)(*returnVar + 0xa8))
                        (returnVar,requestContext_local._4_4_,setter_local,dynamicObject,
                         getter_local);
      if (iVar4 == 0) {
        local_4c = RecyclableObject::GetProperty
                             ((RecyclableObject *)returnVar,pvStack_18,requestContext_local._4_4_,
                              &stack0xffffffffffffffb8,(PropertyValueInfo *)0x0,
                              (ScriptContext *)getter_local);
      }
    }
    else {
      BVar3 = DynamicObject::GetAccessors
                        ((DynamicObject *)returnVar,requestContext_local._4_4_,setter_local,
                         (Var *)dynamicObject,(ScriptContext *)getter_local);
      if (BVar3 == 0) {
        val = DynamicObject::GetPropertyQuery
                        ((DynamicObject *)returnVar,pvStack_18,requestContext_local._4_4_,
                         &stack0xffffffffffffffb8,(PropertyValueInfo *)0x0,
                         (ScriptContext *)getter_local);
        local_4c = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
      }
    }
    if (local_4c == 0) {
      pJVar6 = ScriptContext::GetLibrary((ScriptContext *)getter_local);
      instance_local = JavascriptLibraryBase::GetUndefined(&pJVar6->super_JavascriptLibraryBase);
    }
    else {
      instance_local = pRStack_48;
    }
  }
  return instance_local;
}

Assistant:

Var JavascriptOperators::GetOwnPropertyNoHostObjectForHeapEnum(Var instance, PropertyId propertyId, ScriptContext* requestContext, Var& getter, Var& setter)
    {
        AssertMsg(!TaggedNumber::Is(instance), "GetDataPropertyNoHostObject int passed");
        Assert(HasOwnPropertyNoHostObjectForHeapEnum(instance, propertyId, requestContext, getter, setter) || getter || setter);
        DynamicObject* dynamicObject = VarTo<DynamicObject>(instance);
        getter = setter = NULL;
        if (NULL == dynamicObject)
        {
            return requestContext->GetLibrary()->GetUndefined();
        }
        Var returnVar = requestContext->GetLibrary()->GetUndefined();
        BOOL result = FALSE;
        if (dynamicObject->UseDynamicObjectForNoHostObjectAccess())
        {
            if (! dynamicObject->DynamicObject::GetAccessors(propertyId, &getter, &setter, requestContext))
            {
                result = JavascriptConversion::PropertyQueryFlagsToBoolean((dynamicObject->DynamicObject::GetPropertyQuery(instance, propertyId, &returnVar, NULL, requestContext)));
            }
        }
        else
        {
            if (! dynamicObject->GetAccessors(propertyId, &getter, &setter, requestContext))
            {
                result = dynamicObject->GetProperty(instance, propertyId, &returnVar, NULL, requestContext);
            }
        }

        if (result)
        {
            return returnVar;
        }
        return requestContext->GetLibrary()->GetUndefined();
    }